

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  size_type sVar3;
  longlong lVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  value_type_conflict2 local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  value_type_conflict2 local_50 [5];
  undefined1 local_39;
  char *pcStack_38;
  char delimiter;
  char *trimmed_whitespace;
  size_t end;
  size_t start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *in_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret;
  
  start._7_1_ = 0;
  local_18 = in;
  in_local = (string *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  pbVar1 = local_18;
  end = 0;
  trimmed_whitespace = (char *)0x0;
  pcStack_38 = " \t\n\r\f\v";
  local_39 = 0x20;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(local_18," \t\n\r\f\v",0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (pbVar1,sVar3 + 1,0xffffffffffffffff);
  pbVar1 = local_18;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of(local_18," \t\n\r\f\v",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (pbVar1,0,sVar3);
  while (trimmed_whitespace =
              (char *)std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                (local_18,' ',end), trimmed_whitespace != (char *)0xffffffffffffffff
        ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,local_18,end,(long)trimmed_whitespace - end);
    lVar4 = std::__cxx11::stoll(&local_70,(size_t *)0x0,10);
    local_50[0] = (value_type_conflict2)lVar4;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,local_50);
    std::__cxx11::string::~string((string *)&local_70);
    end = (size_t)trimmed_whitespace;
    do {
      end = end + 1;
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](local_18,end);
      iVar2 = isspace((int)*pvVar5);
    } while (iVar2 != 0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_98,local_18,end,0xffffffffffffffff);
  lVar4 = std::__cxx11::stoll(&local_98,(size_t *)0x0,10);
  local_74 = (value_type_conflict2)lVar4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (__return_storage_ptr__,&local_74);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector <idx_t> helper_parse_space_sep_ints(std::string &in) {
            std::vector <idx_t> ret;

            std::size_t start = 0;
            std::size_t end = 0;
            constexpr auto trimmed_whitespace = " \t\n\r\f\v";
            constexpr auto delimiter = ' ';

            // trim leading and trailing whitespace
            in.erase(in.find_last_not_of(trimmed_whitespace) + 1);
            in.erase(0, in.find_first_not_of(trimmed_whitespace));

            while (std::string::npos != (end = in.find(delimiter, start))) {
                ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start, end - start))));
                start = end + 1;
                while (::isspace(in[start]))
                    ++start;
            }
            ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start))));
            return ret;
        }